

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_cmd_array.c
# Opt level: O2

nsh_status_t nsh_cmd_array_lexicographic_sort(nsh_cmd_array_t *cmds)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint j;
  ulong uVar5;
  nsh_cmd_t *cmd2;
  
  uVar4 = cmds->count;
  uVar2 = 1;
  for (uVar3 = 0; uVar3 < uVar4 - 1; uVar3 = uVar3 + 1) {
    uVar5 = (ulong)uVar2;
    cmd2 = cmds->array + uVar5;
    for (; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      iVar1 = strcmp(cmds->array[uVar3].name,cmd2->name);
      if (0 < iVar1) {
        nsh_cmd_swap(cmds->array + uVar3,cmd2);
        uVar4 = cmds->count;
      }
      cmd2 = cmd2 + 1;
    }
    uVar2 = uVar2 + 1;
  }
  return NSH_STATUS_OK;
}

Assistant:

nsh_status_t nsh_cmd_array_lexicographic_sort(nsh_cmd_array_t* cmds)
{
    for (unsigned int i = 0; i < cmds->count - 1; ++i) {
        for (unsigned int j = i + 1; j < cmds->count; ++j) {
            if (strcmp(cmds->array[i].name, cmds->array[j].name) > 0) {
                nsh_cmd_swap(&cmds->array[i], &cmds->array[j]);
            }
        }
    }
    return NSH_STATUS_OK;
}